

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

Aig_Man_t * Ivy_FraigExtractCone(Ivy_Man_t *p,Ivy_Obj_t *pObj1,Ivy_Obj_t *pObj2,Vec_Int_t *vLeaves)

{
  undefined1 *puVar1;
  int iVar2;
  uint uVar3;
  void *pvVar4;
  Vec_Int_t *vNodes;
  int *piVar5;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  Aig_Obj_t *p1;
  long lVar8;
  
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  piVar5 = (int *)malloc(400);
  vNodes->pArray = piVar5;
  puVar1 = &p->pConst1->field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x20;
  Ivy_FraigExtractCone_rec(p,pObj1,vLeaves,vNodes);
  Ivy_FraigExtractCone_rec(p,pObj2,vLeaves,vNodes);
  puVar1 = &p->pConst1->field_0x8;
  *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffdf;
  p_00 = Aig_ManStart(1000);
  p->pConst1->pEquiv = (Ivy_Obj_t *)p_00->pConst1;
  if (0 < vLeaves->nSize) {
    lVar8 = 0;
    do {
      iVar2 = vLeaves->pArray[lVar8];
      if (((long)iVar2 < 0) || (p->vObjs->nSize <= iVar2)) goto LAB_0079e739;
      pvVar4 = p->vObjs->pArray[iVar2];
      if (pvVar4 == (void *)0x0) break;
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar4 + 0x48) = pAVar6;
      *(byte *)((long)pvVar4 + 8) = *(byte *)((long)pvVar4 + 8) & 0xdf;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vLeaves->nSize);
  }
  if (0 < vNodes->nSize) {
    lVar8 = 0;
    do {
      iVar2 = vNodes->pArray[lVar8];
      if (((long)iVar2 < 0) || (p->vObjs->nSize <= iVar2)) {
LAB_0079e739:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = p->vObjs->pArray[iVar2];
      if (pvVar4 == (void *)0x0) break;
      if (((ulong)pvVar4 & 1) != 0) {
        __assert_fail("!Ivy_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivy.h"
                      ,0x113,"Ivy_Obj_t *Ivy_ObjChild0Equiv(Ivy_Obj_t *)");
      }
      uVar7 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar6 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar6 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x48));
      }
      uVar7 = *(ulong *)((long)pvVar4 + 0x18) & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)
             ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x18) & 1) ^ *(ulong *)(uVar7 + 0x48));
      }
      pAVar6 = Aig_And(p_00,pAVar6,p1);
      *(Aig_Obj_t **)((long)pvVar4 + 0x48) = pAVar6;
      uVar3 = *(uint *)((long)pvVar4 + 8);
      *(uint *)((long)pvVar4 + 8) = uVar3 & 0xffffffdf;
      if (((uVar3 >> 7 ^ *(uint *)&pAVar6->field_0x18 >> 3) & 1) != 0) {
        __assert_fail("pMiter->fPhase == pObjIvy->fPhase",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFraig.c"
                      ,0xb50,
                      "Aig_Man_t *Ivy_FraigExtractCone(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *, Vec_Int_t *)"
                     );
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vNodes->nSize);
  }
  pAVar6 = Aig_Exor(p_00,(Aig_Obj_t *)pObj1->pEquiv,(Aig_Obj_t *)pObj2->pEquiv);
  Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                       ((ulong)(((uint)pAVar6 ^
                                *(uint *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18) >> 3) & 1) ^
                       (ulong)pAVar6));
  Aig_ManCleanup(p_00);
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (int *)0x0;
  }
  free(vNodes);
  return p_00;
}

Assistant:

Aig_Man_t * Ivy_FraigExtractCone( Ivy_Man_t * p, Ivy_Obj_t * pObj1, Ivy_Obj_t * pObj2, Vec_Int_t * vLeaves )
{
    Aig_Man_t * pMan;
    Aig_Obj_t * pMiter;
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObjIvy;
    int i;
    // collect nodes
    vNodes  = Vec_IntAlloc( 100 );
    Ivy_ManConst1(p)->fMarkB = 1;
    Ivy_FraigExtractCone_rec( p, pObj1, vLeaves, vNodes );
    Ivy_FraigExtractCone_rec( p, pObj2, vLeaves, vNodes );
    Ivy_ManConst1(p)->fMarkB = 0;
    // create new manager
    pMan = Aig_ManStart( 1000 );
    Ivy_ManConst1(p)->pEquiv = (Ivy_Obj_t *)Aig_ManConst1(pMan);
    Ivy_ManForEachNodeVec( p, vLeaves, pObjIvy, i )
    {
        pObjIvy->pEquiv = (Ivy_Obj_t *)Aig_ObjCreateCi( pMan );
        pObjIvy->fMarkB = 0;
    }
    // duplicate internal nodes
    Ivy_ManForEachNodeVec( p, vNodes, pObjIvy, i )
    {

        pObjIvy->pEquiv = (Ivy_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Ivy_ObjChild0Equiv(pObjIvy), (Aig_Obj_t *)Ivy_ObjChild1Equiv(pObjIvy) );
        pObjIvy->fMarkB = 0;

        pMiter = (Aig_Obj_t *)pObjIvy->pEquiv;
        assert( pMiter->fPhase == pObjIvy->fPhase );
    }
    // create the PO
    pMiter = Aig_Exor( pMan, (Aig_Obj_t *)pObj1->pEquiv, (Aig_Obj_t *)pObj2->pEquiv );
    pMiter = Aig_NotCond( pMiter, Aig_Regular(pMiter)->fPhase ^ Aig_IsComplement(pMiter) );

/*
printf( "Polarity = %d\n", pMiter->fPhase );
    if ( Ivy_ObjIsConst1(pObj1) || Ivy_ObjIsConst1(pObj2) )
    {
        pMiter = Aig_NotCond( pMiter, 1 );
printf( "***************\n" );
    }
*/
    pMiter = Aig_ObjCreateCo( pMan, pMiter );
//printf( "Polarity = %d\n", pMiter->fPhase );
    Aig_ManCleanup( pMan );
    Vec_IntFree( vNodes );
    return pMan;
}